

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O3

longlong __thiscall
shift_window_transformer::StageModule<float>::parameterCount(StageModule<float> *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  pointer ppSVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  pvVar1 = (this->patch_partition).layer.weights;
  lVar4 = (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if ((this->patch_partition).layer.use_bias == true) {
    pvVar1 = (this->patch_partition).layer.bias;
    lVar4 = lVar4 + ((long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  ppSVar2 = (this->layers).
            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->layers).
      super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    uVar5 = 0;
    do {
      lVar3 = (**(code **)(*(long *)ppSVar2[uVar5] + 8))();
      lVar4 = lVar4 + lVar3;
      uVar5 = uVar5 + 1;
      ppSVar2 = (this->layers).
                super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->layers).
                                   super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3))
    ;
  }
  return lVar4;
}

Assistant:

long long parameterCount() {
            long long ret = patch_partition.parameterCount();
            for (int i = 0; i < layers.size(); ++i) {
                ret += layers[i]->parameterCount();
            }
            return ret;
        }